

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_SetupRenderState
               (ImDrawData *draw_data,int fb_width,int fb_height,GLuint vertex_array_object)

{
  GLenum GVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  GLenum current_clip_origin;
  float local_68 [6];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  glEnable(0xbe2);
  (*__glewBlendEquation)(0x8006);
  glBlendFunc(0x302,0x303);
  glDisable(0xb44);
  glDisable(0xb71);
  glEnable(0xc11);
  glPolygonMode(0x408,0x1b02);
  current_clip_origin = 0;
  glGetIntegerv(0x935c,&current_clip_origin);
  GVar1 = current_clip_origin;
  glViewport(0,0,fb_width,fb_height);
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[4] = 0.0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0xbf800000;
  fVar2 = (draw_data->DisplayPos).x;
  fVar3 = (draw_data->DisplayPos).y;
  fVar4 = (draw_data->DisplaySize).x + fVar2;
  fVar5 = (draw_data->DisplaySize).y + fVar3;
  fVar6 = fVar3;
  fVar7 = fVar5;
  if (GVar1 != 0x8ca2) {
    fVar6 = fVar5;
    fVar7 = fVar3;
  }
  local_68[0] = 2.0 / (fVar4 - fVar2);
  local_68[5] = 2.0 / (fVar7 - fVar6);
  auVar8._0_4_ = fVar2 + fVar4;
  auVar8._4_4_ = fVar3 + fVar5;
  auVar8._8_8_ = 0;
  auVar9._4_4_ = fVar6 - fVar7;
  auVar9._0_4_ = fVar2 - fVar4;
  auVar9._8_4_ = fVar3 - fVar5;
  auVar9._12_4_ = fVar6 - fVar7;
  auVar9 = divps(auVar8,auVar9);
  local_38 = auVar9._0_8_;
  uStack_30 = 0x3f80000000000000;
  (*__glewUseProgram)(g_ShaderHandle);
  (*__glewUniform1i)(g_AttribLocationTex,0);
  (*__glewUniformMatrix4fv)(g_AttribLocationProjMtx,1,'\0',local_68);
  (*__glewBindSampler)(0,0);
  (*__glewBindVertexArray)(vertex_array_object);
  (*__glewBindBuffer)(0x8892,g_VboHandle);
  (*__glewBindBuffer)(0x8893,g_ElementsHandle);
  (*__glewEnableVertexAttribArray)(g_AttribLocationVtxPos);
  (*__glewEnableVertexAttribArray)(g_AttribLocationVtxUV);
  (*__glewEnableVertexAttribArray)(g_AttribLocationVtxColor);
  (*__glewVertexAttribPointer)(g_AttribLocationVtxPos,2,0x1406,'\0',0x14,(void *)0x0);
  (*__glewVertexAttribPointer)(g_AttribLocationVtxUV,2,0x1406,'\0',0x14,(void *)0x8);
  (*__glewVertexAttribPointer)(g_AttribLocationVtxColor,4,0x1401,'\x01',0x14,(void *)0x10);
  return;
}

Assistant:

static void ImGui_ImplOpenGL3_SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height, GLuint vertex_array_object)
{
    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)
    bool clip_origin_lower_left = true;
#if defined(GL_CLIP_ORIGIN) && !defined(__APPLE__)
    GLenum current_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&current_clip_origin);
    if (current_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
    if (!clip_origin_lower_left) { float tmp = T; T = B; B = tmp; } // Swap top and bottom if origin is upper left
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(g_ShaderHandle);
    glUniform1i(g_AttribLocationTex, 0);
    glUniformMatrix4fv(g_AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 may set that otherwise.
#endif

    (void)vertex_array_object;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(vertex_array_object);
#endif

    // Bind vertex/index buffers and setup attributes for ImDrawVert
    glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_ElementsHandle);
    glEnableVertexAttribArray(g_AttribLocationVtxPos);
    glEnableVertexAttribArray(g_AttribLocationVtxUV);
    glEnableVertexAttribArray(g_AttribLocationVtxColor);
    glVertexAttribPointer(g_AttribLocationVtxPos,   2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, pos));
    glVertexAttribPointer(g_AttribLocationVtxUV,    2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, uv));
    glVertexAttribPointer(g_AttribLocationVtxColor, 4, GL_UNSIGNED_BYTE, GL_TRUE,  sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, col));
}